

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O2

void __thiscall
agg::pod_bvector<agg::point_base<double>,_6U>::add
          (pod_bvector<agg::point_base<double>,_6U> *this,point_base<double> *val)

{
  double dVar1;
  point_base<double> *ppVar2;
  
  ppVar2 = data_ptr(this);
  dVar1 = val->y;
  ppVar2->x = val->x;
  ppVar2->y = dVar1;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void pod_bvector<T, S>::add(const T& val)
    {
        *data_ptr() = val;
        ++m_size;
    }